

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O2

ptls_cipher_context_t *
ptls_ffx_new(ptls_cipher_algorithm_t *algo,int is_enc,int nb_rounds,size_t bit_length,void *key)

{
  int iVar1;
  ptls_cipher_context_t *_ctx;
  
  _ctx = (ptls_cipher_context_t *)calloc(1,0x60);
  if (_ctx != (ptls_cipher_context_t *)0x0) {
    iVar1 = ptls_ffx_setup_crypto(_ctx,algo,is_enc,nb_rounds,bit_length,key);
    if (iVar1 == 0) {
      return _ctx;
    }
    free(_ctx);
  }
  return (ptls_cipher_context_t *)0x0;
}

Assistant:

ptls_cipher_context_t *ptls_ffx_new(ptls_cipher_algorithm_t *algo, int is_enc, int nb_rounds, size_t bit_length, const void *key)
{
    ptls_cipher_context_t *ctx = (ptls_cipher_context_t *)malloc(sizeof(ptls_ffx_context_t));

    if (ctx != NULL) {
        memset(ctx, 0, sizeof(ptls_ffx_context_t));
        if (ptls_ffx_setup_crypto(ctx, algo, is_enc, nb_rounds, bit_length, key) != 0) {
            free(ctx);
            ctx = NULL;
        }
    }

    return ctx;
}